

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O2

void CoreMLConverter::unsupportedCaffeParrameterWithOption
               (string *parameterName,string *layerName,string *layerType,string *optionName)

{
  ostream *poVar1;
  runtime_error *this;
  string local_1d0 [32];
  stringstream ss;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_1a0,"Unsupported option \'");
  poVar1 = std::operator<<(poVar1,(string *)optionName);
  poVar1 = std::operator<<(poVar1,"\' for the parameter \'");
  poVar1 = std::operator<<(poVar1,(string *)parameterName);
  poVar1 = std::operator<<(poVar1,"\' in layer \'");
  poVar1 = std::operator<<(poVar1,(string *)layerName);
  poVar1 = std::operator<<(poVar1,"\' of type \'");
  poVar1 = std::operator<<(poVar1,(string *)layerType);
  poVar1 = std::operator<<(poVar1,"\' during caffe conversion.");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void unsupportedCaffeParrameterWithOption(const std::string& parameterName,
                                                   const std::string& layerName,
                                                   const std::string& layerType,
                                                   const std::string& optionName) {
        
        std::stringstream ss;
        ss << "Unsupported option '" << optionName << "' for the parameter '"
           << parameterName << "' in layer '"<< layerName<< "' of type '" << layerType<< "' during caffe conversion."
           << std::endl;
        throw std::runtime_error(ss.str());
    }